

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::CheckFuncTypeIndex(SharedValidator *this,Var *sig_var,FuncType *out)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  pointer pTVar3;
  Result RVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  Var local_70;
  
  Var::Var(&local_70,sig_var);
  RVar4 = CheckIndex(this,&local_70,this->num_types_,"function type");
  Var::~Var(&local_70);
  if (RVar4.enum_ == Error) {
    pTVar3 = (out->params).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    (out->params).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (out->params).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (out->params).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pTVar3 != (pointer)0x0) {
      operator_delete(pTVar3);
    }
    pTVar3 = (out->results).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    (out->results).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (out->results).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (out->results).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RVar4.enum_ = Error;
    if (pTVar3 != (pointer)0x0) {
      operator_delete(pTVar3);
    }
  }
  else {
    if (sig_var->type_ != Index) {
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h",
                    0x38,"Index wabt::Var::index() const");
    }
    _Var2 = (sig_var->field_2).index_;
    p_Var1 = &(this->func_types_)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = (this->func_types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var1->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[bVar7]) {
      bVar7 = p_Var6[1]._M_color < _Var2;
      if (!bVar7) {
        p_Var5 = p_Var6;
      }
    }
    p_Var6 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var6 = p_Var5, _Var2 < p_Var5[1]._M_color)) {
      p_Var6 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      RVar4 = PrintError(this,&sig_var->loc,"type %d is not a function");
    }
    else {
      RVar4.enum_ = Ok;
      if (out != (FuncType *)0x0) {
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                  (&out->params,
                   (vector<wabt::Type,_std::allocator<wabt::Type>_> *)&p_Var6[1]._M_parent);
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                  (&out->results,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)(p_Var6 + 2));
      }
    }
  }
  return (Result)RVar4.enum_;
}

Assistant:

Result SharedValidator::CheckFuncTypeIndex(Var sig_var, FuncType* out) {
  Result result = CheckIndex(sig_var, num_types_, "function type");
  if (Failed(result)) {
    *out = FuncType{};
    return Result::Error;
  }

  auto iter = func_types_.find(sig_var.index());
  if (iter == func_types_.end()) {
    return PrintError(sig_var.loc, "type %d is not a function",
                      sig_var.index());
  }

  if (out) {
    *out = iter->second;
  }
  return Result::Ok;
}